

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_265da4::SndioCapture::stop(SndioCapture *this)

{
  __int_type_conflict _Var1;
  int iVar2;
  
  LOCK();
  _Var1 = (this->mKillNow)._M_base._M_i;
  (this->mKillNow)._M_base._M_i = true;
  UNLOCK();
  if (((_Var1 & 1U) == 0) && ((this->mThread)._M_id._M_thread != 0)) {
    std::thread::join();
    iVar2 = sio_stop(this->mSndHandle);
    if ((iVar2 == 0) && (0 < (int)gLogLevel)) {
      fwrite("[ALSOFT] (EE) Error stopping device\n",0x24,1,(FILE *)gLogFile);
      return;
    }
  }
  return;
}

Assistant:

void SndioCapture::stop()
{
    if(mKillNow.exchange(true, std::memory_order_acq_rel) || !mThread.joinable())
        return;
    mThread.join();

    if(!sio_stop(mSndHandle))
        ERR("Error stopping device\n");
}